

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void expect_range(char *function,char *parameter,char *file,int line,unsigned_long minimum,
                 unsigned_long maximum,CheckParameterValue check_function,int count)

{
  char *file_00;
  char *in_R8;
  char *in_R9;
  CheckParameterEvent *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_00000010;
  ValuePointer check_data;
  CheckIntegerRange *check_integer_range;
  undefined4 in_stack_ffffffffffffffb4;
  CheckParameterValue in_stack_ffffffffffffffb8;
  
  file_00 = (char *)malloc(0x38);
  *(char **)(file_00 + 0x28) = in_R8;
  *(char **)(file_00 + 0x30) = in_R9;
  _expect_check(in_R8,in_R9,file_00,(int)((ulong)file_00 >> 0x20),in_stack_ffffffffffffffb8,
                CONCAT44(in_stack_ffffffffffffffb4,in_stack_00000010),unaff_retaddr,
                in_stack_00000008);
  return;
}

Assistant:

static void expect_range(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const LargestIntegralType minimum, const LargestIntegralType maximum,
        const CheckParameterValue check_function, const int count) {
    CheckIntegerRange * const check_integer_range =
        (CheckIntegerRange*)malloc(sizeof(*check_integer_range));
    declare_initialize_value_pointer_pointer(check_data, check_integer_range);
    check_integer_range->minimum = minimum;
    check_integer_range->maximum = maximum;
    _expect_check(function, parameter, file, line, check_function,
                  check_data.value, &check_integer_range->event, count);
}